

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::InternalSerializeWithCachedSizesToArray
          (CodeGeneratorRequest *this,bool deterministic,uint8 *target)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar1;
  char *data;
  string *psVar2;
  Version *this_01;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  Type *pTVar6;
  Type *this_02;
  uint8 *puVar7;
  uint uVar8;
  byte *pbVar9;
  int iVar10;
  
  iVar1 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar1) {
    this_00 = &this->file_to_generate_;
    iVar10 = 0;
    do {
      pTVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar10);
      data = (pTVar6->_M_dataplus)._M_p;
      pTVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar10);
      internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar6->_M_string_length,SERIALIZE,
                 "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
      pTVar6 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar10);
      *target = '\n';
      target = io::CodedOutputStream::WriteStringWithSizeToArray(pTVar6,target + 1);
      iVar10 = iVar10 + 1;
    } while (iVar1 != iVar10);
  }
  uVar8 = (this->_has_bits_).has_bits_[0];
  if ((uVar8 & 1) != 0) {
    psVar2 = (this->parameter_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    psVar2 = (this->parameter_).ptr_;
    *target = '\x12';
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar2,target + 1);
  }
  if ((uVar8 & 2) != 0) {
    this_01 = this->compiler_version_;
    *target = '\x1a';
    pbVar9 = target + 1;
    uVar8 = this_01->_cached_size_;
    uVar5 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar9 = (byte)uVar8 | 0x80;
        uVar5 = uVar8 >> 7;
        pbVar9 = pbVar9 + 1;
        bVar4 = 0x3fff < uVar8;
        uVar8 = uVar5;
      } while (bVar4);
    }
    *pbVar9 = (byte)uVar5;
    target = Version::InternalSerializeWithCachedSizesToArray(this_01,false,pbVar9 + 1);
  }
  iVar1 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar10 = 0;
    do {
      this_02 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                          (&(this->proto_file_).super_RepeatedPtrFieldBase,iVar10);
      *target = 'z';
      pbVar9 = target + 1;
      uVar8 = this_02->_cached_size_;
      uVar5 = uVar8;
      if (0x7f < uVar8) {
        do {
          *pbVar9 = (byte)uVar8 | 0x80;
          uVar5 = uVar8 >> 7;
          pbVar9 = pbVar9 + 1;
          bVar4 = 0x3fff < uVar8;
          uVar8 = uVar5;
        } while (bVar4);
      }
      *pbVar9 = (byte)uVar5;
      target = FileDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (this_02,deterministic,pbVar9 + 1);
      iVar10 = iVar10 + 1;
    } while (iVar10 != iVar1);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar7 = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target);
    return puVar7;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* CodeGeneratorRequest::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorRequest)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string file_to_generate = 1;
  for (int i = 0, n = this->file_to_generate_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->file_to_generate(i).data(), this->file_to_generate(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(1, this->file_to_generate(i), target);
  }

  cached_has_bits = _has_bits_[0];
  // optional string parameter = 2;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->parameter().data(), this->parameter().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->parameter(), target);
  }

  // optional .google.protobuf.compiler.Version compiler_version = 3;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, *this->compiler_version_, deterministic, target);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (unsigned int i = 0, n = this->proto_file_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        15, this->proto_file(i), deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorRequest)
  return target;
}